

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O2

int av1_optimize_txb(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,TX_SIZE tx_size,TX_TYPE tx_type
                    ,TXB_CTX *txb_ctx,int *rate_cost,int sharpness)

{
  CommonQuantParams *quant_params;
  byte bVar1;
  short sVar2;
  tran_low_t tVar3;
  MB_MODE_INFO *pMVar4;
  uint dqcoeff;
  TX_CLASS tx_class;
  LV_MAP_COEFF_COST *pLVar5;
  LV_MAP_COEFF_COST *txb_costs;
  MACROBLOCKD *xd;
  qm_val_t *pqVar6;
  undefined8 uVar7;
  uint8_t uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar17;
  int64_t iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  int iVar24;
  uint uVar25;
  int (*paiVar26) [26];
  ulong uVar27;
  tran_low_t *dqcoeff_00;
  int iVar28;
  int iVar29;
  undefined7 in_register_00000081;
  long lVar30;
  undefined7 in_register_00000089;
  uint uVar31;
  uint uVar32;
  tran_low_t *qcoeff;
  uint8_t *puVar33;
  int16_t *scan;
  int iVar34;
  int (*paiVar35) [26];
  undefined8 uVar36;
  bool bVar37;
  uint local_734;
  ulong local_730;
  undefined8 local_728;
  int (*local_720) [26];
  int (*local_718) [26];
  int (*local_710) [26];
  tran_low_t *local_708;
  int (*local_700) [26];
  int (*local_6f8) [26];
  undefined8 local_6f0;
  int *local_6e8;
  ulong local_6e0;
  long local_6d8;
  undefined8 local_6d0;
  int (*local_6c8) [26];
  undefined8 local_6c0;
  LV_MAP_COEFF_COST *local_6b8;
  undefined8 local_6b0;
  MACROBLOCKD *local_6a8;
  int local_69c;
  qm_val_t *local_698;
  undefined8 local_690;
  int16_t *local_688;
  uint local_67c;
  tran_low_t *local_678;
  ulong local_670;
  LV_MAP_EOB_COST *local_668;
  uint local_65c;
  ulong local_658;
  tran_low_t *local_650;
  int64_t dummy_dist;
  int (*local_640) [26];
  int local_634;
  ulong local_630;
  qm_val_t *local_628;
  int16_t *local_620;
  undefined8 local_618;
  int (*local_610) [8];
  uint local_604;
  int (*local_600) [8];
  ulong local_5f8;
  ulong local_5f0;
  uint8_t *local_5e8;
  uint8_t *local_5e0;
  uint8_t *local_5d8;
  int (*local_5d0) [26];
  ulong local_5c8;
  int nz_ci [3];
  uint8_t levels_buf [1312];
  
  local_6a8 = &x->e_mbd;
  lVar16 = (long)plane;
  local_630 = CONCAT71(in_register_00000081,tx_size) & 0xffffffff;
  local_730 = CONCAT71(in_register_00000089,tx_type) & 0xffffffff;
  uVar21 = (ulong)(uint)((int)CONCAT71(in_register_00000089,tx_type) << 4);
  uVar9 = (int)CONCAT71(in_register_00000081,tx_size) << 8;
  local_688 = *(int16_t **)((long)&av1_scan_orders[0][0].scan + uVar21 + uVar9);
  local_708 = (tran_low_t *)lVar16;
  local_634 = plane;
  iVar10 = av1_get_tx_scale(tx_size);
  xd = local_6a8;
  local_690 = CONCAT44(extraout_var,iVar10);
  local_728 = CONCAT44(local_728._4_4_,block);
  local_620 = x->plane[lVar16].dequant_QTX;
  local_658 = (ulong)x->plane[lVar16].eobs[block];
  quant_params = &(cpi->common).quant_params;
  local_628 = av1_get_iqmatrix(quant_params,local_6a8,(int)local_708,tx_size,tx_type);
  if ((cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR) {
    local_698 = av1_get_qmatrix(quant_params,xd,local_634,tx_size,tx_type);
  }
  else {
    local_698 = (qm_val_t *)0x0;
  }
  iVar10 = (int)local_728 << 4;
  qcoeff = x->plane[lVar16].qcoeff + iVar10;
  local_708 = x->plane[lVar16].dqcoeff + iVar10;
  local_650 = x->plane[lVar16].coeff + iVar10;
  bVar23 = ""[local_630];
  bVar1 = ""[local_630];
  local_670 = (ulong)""[local_730];
  pMVar4 = *(x->e_mbd).mi;
  iVar10 = get_txb_bhl(tx_size);
  local_728 = CONCAT44(extraout_var_00,iVar10);
  iVar10 = get_txb_wide(tx_size);
  local_618 = CONCAT44(extraout_var_01,iVar10);
  local_604 = (uint)tx_size;
  iVar10 = get_txb_high(tx_size);
  scan = local_688;
  if ((pMVar4->field_0xa7 & 0x80) == 0) {
    uVar27 = (ulong)('\0' < pMVar4->ref_frame[0]);
  }
  else {
    uVar27 = 1;
  }
  bVar37 = local_634 != 0;
  local_6b8 = (x->coeff_costs).coeff_costs[(uint)bVar23 + (uint)bVar1 + 1 >> 1 & 0xff] + bVar37;
  local_668 = (x->coeff_costs).eob_costs[""[local_630]] + bVar37;
  bVar23 = (((cpi->oxcf).tune_cfg.tuning & ~AOM_TUNE_SSIM) == AOM_TUNE_IQ) * '\x02' | 5;
  local_6d8 = (long)((ulong)((uint)(1 << bVar23) >> 1) +
                    (long)(plane_rd_mult[uVar27][bVar37] <<
                          ((char)(x->e_mbd).bd * '\x02' - 0x10U & 0x1f)) *
                    (long)(8 - sharpness) * (long)x->rdmult) >> bVar23;
  if (1 < (ushort)local_658) {
    (*av1_txb_init_levels)(qcoeff,(int)local_618,iVar10,levels_buf);
  }
  uVar27 = local_658;
  pLVar5 = local_6b8;
  iVar10 = local_6b8->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  iVar15 = local_6b8->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  iVar28 = (int)local_658;
  iVar12 = (int)local_670;
  tx_class = (TX_CLASS)local_670;
  uVar11 = get_eob_cost(iVar28,local_668,local_6b8,tx_class);
  dqcoeff_00 = local_708;
  uVar36 = local_728;
  local_640 = (int (*) [26])0x0;
  sVar2 = scan[uVar27 - 1];
  uVar32 = qcoeff[sVar2];
  uVar13 = -uVar32;
  if (0 < (int)uVar32) {
    uVar13 = uVar32;
  }
  nz_ci[0] = (int)sVar2;
  nz_ci[1] = 0;
  nz_ci[2] = 0;
  iVar24 = iVar28 + -1;
  bVar23 = (byte)local_728;
  local_734 = uVar11;
  if (uVar13 < 2) {
    if (iVar24 == 0) {
      uVar31 = 0;
    }
    else {
      iVar12 = (int)local_618 << (bVar23 & 0x1f);
      uVar31 = 1;
      if (iVar12 / 8 < iVar24) {
        uVar31 = iVar12 / 4 < iVar24 | 2;
      }
    }
    iVar12 = get_coeff_cost_eob(nz_ci[0],uVar13,uVar32 >> 0x1f,uVar31,txb_ctx->dc_sign_ctx,local_6b8
                                ,(int)local_728,(TX_CLASS)local_670);
    uVar7 = local_690;
    pqVar6 = local_698;
    local_734 = iVar12 + uVar11;
    tVar3 = local_650[sVar2];
    iVar18 = get_coeff_dist(tVar3,local_708[sVar2],(int)local_690,local_698,(int)sVar2);
    lVar17 = (long)(tVar3 << ((byte)uVar7 & 0x1f));
    if (pqVar6 == (qm_val_t *)0x0) {
      uVar27 = lVar17 * lVar17;
    }
    else {
      lVar17 = (ulong)pqVar6[sVar2] * lVar17;
      uVar27 = lVar17 * lVar17 + 0x200U >> 10;
    }
    local_640 = (int (*) [26])(iVar18 - uVar27);
    iVar12 = (int)local_670;
    uVar27 = local_658;
    scan = local_688;
    dqcoeff_00 = local_708;
  }
  else {
    update_coeff_general
              ((int *)&local_734,(int64_t *)&local_640,iVar24,iVar28,(TX_SIZE)local_604,tx_class,
               (int)local_728,(int)local_618,local_6d8,(int)local_690,txb_ctx->dc_sign_ctx,local_620
               ,scan,pLVar5,local_650,qcoeff,local_708,levels_buf,local_628,local_698);
  }
  pLVar5 = local_6b8;
  uVar27 = (ulong)((int)uVar27 - 2);
  iVar28 = (int)local_618;
  uVar32 = local_734;
  local_678 = qcoeff;
  if (iVar12 == 0) {
    local_6c8 = local_640;
    local_5e8 = (uint8_t *)(long)(1 << (bVar23 & 0x1f));
    local_5f8 = (ulong)(2 << (bVar23 & 0x1f));
    local_610 = local_6b8->base_cost;
    iVar28 = iVar28 << (bVar23 & 0x1f);
    local_600 = (int (*) [8])CONCAT44(local_600._4_4_,iVar28 / 8);
    local_65c = iVar28 / 4;
    uVar19 = 1;
    while ((paiVar35 = local_6c8, -1 < (int)uVar27 && (paiVar35 = local_6c8, (int)uVar19 < 3))) {
      local_6f0 = (uint8_t *)CONCAT44(local_6f0._4_4_,txb_ctx->dc_sign_ctx);
      sVar2 = scan[uVar27];
      paiVar35 = (int (*) [26])(long)sVar2;
      local_730 = uVar27;
      local_710 = (int (*) [26])(ulong)uVar32;
      local_6e0 = uVar19;
      iVar12 = get_dqv(local_620,(int)sVar2,local_628);
      lVar17 = (long)((int)sVar2 + ((int)sVar2 >> ((byte)uVar36 & 0x1f)) * 4);
      if (paiVar35 == (int (*) [26])0x0) {
        iVar28 = 0;
      }
      else {
        uVar32 = (uint)""[levels_buf[lVar17 + 2]] +
                 (uint)""[levels_buf[local_5f8 + lVar17 + 8]] +
                 (uint)""[(levels_buf + lVar17 + 5)[(long)local_5e8]] +
                 (uint)""[levels_buf[lVar17 + 1]] +
                 (uint)""[(levels_buf + lVar17 + 4)[(long)local_5e8]] + 1 >> 1;
        if (3 < uVar32) {
          uVar32 = 4;
        }
        iVar28 = (int)(char)*(uint8_t *)((long)*paiVar35 + (long)av1_nz_map_ctx_offset[local_630]) +
                 uVar32;
      }
      uVar32 = qcoeff[(long)paiVar35];
      uVar13 = (uint)local_730;
      if (uVar32 == 0) {
        uVar32 = (int)local_710 + local_610[iVar28][0];
        uVar19 = local_6e0;
        uVar36 = local_728;
      }
      else {
        uVar13 = -uVar32;
        if (0 < (int)uVar32) {
          uVar13 = uVar32;
        }
        local_6e8 = (int *)(ulong)uVar13;
        tVar3 = local_650[(long)paiVar35];
        lVar22 = (long)(tVar3 << ((byte)local_690 & 0x1f));
        local_700 = (int (*) [26])CONCAT44(local_700._4_4_,iVar28);
        if (local_698 == (qm_val_t *)0x0) {
          local_6f8 = (int (*) [26])(lVar22 * lVar22);
        }
        else {
          local_6f8 = (int (*) [26])
                      ((ulong)local_698[(long)paiVar35] * lVar22 *
                       (ulong)local_698[(long)paiVar35] * lVar22 + 0x200 >> 10);
        }
        uVar32 = (int)uVar32 >> 0x1f;
        uVar13 = -uVar32;
        iVar24 = (int)sVar2;
        local_5d8 = levels_buf + lVar17;
        local_6d0._0_4_ = tVar3;
        local_6b0._0_4_ = iVar12;
        local_720 = (int (*) [26])
                    get_coeff_dist(tVar3,local_708[(long)paiVar35],(int)local_690,local_698,iVar24);
        iVar29 = (int)local_6e8;
        iVar14 = (int)local_728;
        iVar12 = get_coeff_cost_general
                           (0,iVar24,iVar29,uVar13,(uint)local_700,(uint)local_6f0,local_6b8,iVar14,
                            '\0',levels_buf);
        local_6c0 = CONCAT44(local_6c0._4_4_,iVar12);
        local_718 = paiVar35;
        local_67c = uVar13;
        if (iVar29 == 1) {
          uVar32 = local_610[iVar28][0];
          local_5f0 = 0;
          local_6b0 = (uint8_t *)((ulong)local_6b0._4_4_ << 0x20);
          local_700 = (int (*) [26])0x0;
          local_6d0 = (int (*) [26])((ulong)local_6d0._4_4_ << 0x20);
          iVar12 = (int)local_730;
          local_5d0 = local_6c8;
          iVar28 = (uint)local_6f0;
        }
        else {
          uVar11 = iVar29 - 1;
          local_5f0 = (ulong)((uVar11 ^ uVar32) + uVar13);
          iVar12 = ((int)((int)local_6b0 * uVar11) >> ((byte)local_690 & 0x1f) ^ uVar32) + uVar13;
          local_6b0 = (uint8_t *)CONCAT44(local_6b0._4_4_,iVar12);
          iVar18 = get_coeff_dist((int)local_6d0,iVar12,(int)local_690,local_698,iVar24);
          paiVar35 = (int (*) [26])(iVar18 - (long)local_6f8);
          local_6d0 = (int (*) [26])CONCAT44(local_6d0._4_4_,uVar11);
          iVar28 = (uint)local_6f0;
          uVar32 = get_coeff_cost_general
                             (0,iVar24,uVar11,uVar13,(uint)local_700,(uint)local_6f0,local_6b8,
                              iVar14,'\0',levels_buf);
          local_5d0 = (int (*) [26])((long)*local_6c8 + (long)*paiVar35);
          iVar12 = (int)local_730;
          local_700 = paiVar35;
        }
        pLVar5 = local_6b8;
        local_5c8 = (ulong)uVar32;
        local_69c = 0;
        uVar32 = 0;
        if (iVar12 != 0) {
          uVar32 = 1;
          if ((int)local_600 < iVar12) {
            uVar32 = (int)local_65c < iVar12 | 2;
          }
        }
        local_720 = (int (*) [26])((long)local_720 - (long)local_6f8);
        local_5e0 = (uint8_t *)CONCAT44(local_5e0._4_4_,iVar12 + 1);
        iVar12 = get_eob_cost(iVar12 + 1,local_668,local_6b8,'\0');
        uVar13 = local_67c;
        uVar36 = local_728;
        iVar29 = (int)local_728;
        iVar24 = get_coeff_cost_eob((int)local_718,(tran_low_t)local_6e8,local_67c,uVar32,iVar28,
                                    pLVar5,iVar29,'\0');
        local_6f8 = (int (*) [26])CONCAT44(local_6f8._4_4_,iVar12);
        local_6f0 = (uint8_t *)CONCAT44(local_6f0._4_4_,iVar24 + iVar12);
        lVar17 = (long)local_720 * 0x80 + ((iVar24 + iVar12) * local_6d8 + 0x100 >> 9);
        paiVar35 = local_720;
        if ((int)local_6d0 != 0) {
          iVar12 = get_coeff_cost_eob((int)local_718,(int)local_6d0,uVar13,uVar32,iVar28,pLVar5,
                                      iVar29,'\0');
          lVar22 = (long)local_700 * 0x80 +
                   ((int)(iVar12 + (uint)local_6f8) * local_6d8 + 0x100 >> 9);
          paiVar35 = local_720;
          if (lVar22 < lVar17) {
            local_69c = 1;
            local_6f0 = (uint8_t *)CONCAT44(local_6f0._4_4_,iVar12 + (uint)local_6f8);
            paiVar35 = local_700;
            lVar17 = lVar22;
          }
        }
        iVar28 = (int)local_710;
        lVar22 = (long)((long)*local_720 + (long)*local_6c8) * 0x80 +
                 (((int)local_6c0 + iVar28) * local_6d8 + 0x100 >> 9);
        iVar12 = 0;
        uVar13 = (uint)local_730;
        paiVar26 = local_720;
        if ((uVar13 < 6) + 1 < (uint)local_6e8 || sharpness == 0) {
          lVar30 = (long)local_5d0 * 0x80 + (((int)local_5c8 + iVar28) * local_6d8 + 0x100 >> 9);
          iVar12 = 0;
          if (lVar30 < lVar22) {
            local_6c0 = CONCAT44(local_6c0._4_4_,(int)local_5c8);
            iVar12 = 1;
            lVar22 = lVar30;
            paiVar26 = local_700;
          }
        }
        if ((sharpness == 0 || 3 < uVar13) && (lVar17 < lVar22)) {
          uVar27 = local_6e0 & 0xffffffff;
          if ((int)local_6e0 < 1) {
            uVar27 = 0;
          }
          for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
            iVar12 = nz_ci[uVar19];
            levels_buf[iVar12 + (iVar12 >> ((byte)uVar36 & 0x1f)) * 4] = '\0';
            local_678[iVar12] = 0;
            local_708[iVar12] = 0;
          }
          local_658 = (ulong)local_5e0 & 0xffffffff;
          uVar19 = 0;
          uVar32 = (uint)local_6f0;
          iVar12 = local_69c;
        }
        else {
          uVar32 = (int)local_6c0 + iVar28;
          paiVar35 = (int (*) [26])((long)*local_6c8 + (long)*paiVar26);
          uVar19 = local_6e0;
        }
        if (iVar12 != 0) {
          local_678[(long)local_718] = (tran_low_t)local_5f0;
          local_708[(long)local_718] = (int)local_6b0;
          uVar8 = (uint8_t)local_6d0;
          if (0x7e < (int)local_6d0) {
            uVar8 = '\x7f';
          }
          *local_5d8 = uVar8;
        }
        qcoeff = local_678;
        local_6c8 = paiVar35;
        if (local_678[(long)local_718] != 0) {
          nz_ci[(int)uVar19] = (int)local_718;
          uVar19 = (ulong)((int)uVar19 + 1);
        }
      }
      uVar27 = (ulong)(uVar13 - 1);
      dqcoeff_00 = local_708;
      scan = local_688;
    }
LAB_002201aa:
    local_640 = paiVar35;
    local_734 = uVar32;
    uVar32 = (uint)uVar19;
    iVar12 = (int)local_670;
  }
  else {
    if (iVar12 == 1) {
      local_718 = local_640;
      local_5d8 = (uint8_t *)(long)(1 << (bVar23 & 0x1f));
      local_5f0 = (ulong)(2 << (bVar23 & 0x1f));
      local_5e0 = (uint8_t *)(long)(3 << (bVar23 & 0x1f));
      local_610 = (int (*) [8])(long)(4 << (bVar23 & 0x1f));
      iVar28 = iVar28 << (bVar23 & 0x1f);
      uVar19 = 1;
      while ((paiVar35 = local_718, -1 < (int)uVar27 && (paiVar35 = local_718, (int)uVar19 < 3))) {
        local_710 = (int (*) [26])CONCAT44(local_710._4_4_,txb_ctx->dc_sign_ctx);
        sVar2 = scan[uVar27];
        lVar22 = (long)sVar2;
        local_730 = uVar27;
        local_6e0 = uVar19;
        local_6c8 = (int (*) [26])(ulong)uVar32;
        iVar12 = get_dqv(local_620,(int)sVar2,local_628);
        iVar24 = (int)sVar2 >> ((byte)uVar36 & 0x1f);
        lVar17 = (long)((int)sVar2 + iVar24 * 4);
        puVar33 = levels_buf + lVar17;
        uVar32 = (uint)""[*(byte *)((long)(*local_610 + 4) + (long)puVar33)] +
                 (uint)""[(local_5e0 + 0xc)[(long)puVar33]] + (uint)""[puVar33[local_5f0 + 8]] +
                 (uint)""[levels_buf[lVar17 + 1]] + (uint)""[(local_5d8 + 4)[(long)puVar33]] + 1 >>
                 1;
        uVar27 = (ulong)uVar32;
        if (3 < uVar32) {
          uVar27 = 4;
        }
        iVar24 = nz_map_ctx_offset_1d[iVar24];
        uVar32 = qcoeff[lVar22];
        if (uVar32 == 0) {
          uVar32 = (int)local_6c8 + pLVar5->base_cost[uVar27 + (long)iVar24][0];
          uVar13 = (uint)local_730;
          uVar19 = local_6e0;
          uVar36 = local_728;
        }
        else {
          uVar13 = -uVar32;
          if (0 < (int)uVar32) {
            uVar13 = uVar32;
          }
          local_6e8 = (int *)(ulong)uVar13;
          iVar29 = local_650[lVar22];
          lVar17 = (long)(iVar29 << ((byte)local_690 & 0x1f));
          if (local_698 == (qm_val_t *)0x0) {
            local_6f8 = (int (*) [26])(lVar17 * lVar17);
          }
          else {
            local_6f8 = (int (*) [26])
                        ((ulong)local_698[lVar22] * lVar17 * (ulong)local_698[lVar22] * lVar17 +
                         0x200 >> 10);
          }
          uVar32 = (int)uVar32 >> 0x1f;
          uVar13 = -uVar32;
          local_5e8 = puVar33;
          local_6d0._0_4_ = iVar29;
          local_6f0._0_4_ = iVar12;
          local_720 = (int (*) [26])
                      get_coeff_dist(iVar29,local_708[lVar22],(int)local_690,local_698,(int)sVar2);
          iVar14 = (int)local_6e8;
          iVar24 = (int)(uVar27 + (long)iVar24);
          iVar29 = (int)sVar2;
          iVar12 = get_coeff_cost_general
                             (0,iVar29,iVar14,uVar13,iVar24,(uint)local_710,local_6b8,(int)local_728
                              ,'\x01',levels_buf);
          local_6b0 = (uint8_t *)CONCAT44(local_6b0._4_4_,iVar12);
          local_6c0 = lVar22;
          local_67c = uVar13;
          if (iVar14 == 1) {
            uVar32 = pLVar5->base_cost[iVar24][0];
            local_5f8 = 0;
            local_6f0 = (uint8_t *)((ulong)local_6f0._4_4_ << 0x20);
            local_700 = (int (*) [26])0x0;
            local_6d0 = (int (*) [26])((ulong)local_6d0._4_4_ << 0x20);
            iVar12 = (int)local_730;
            local_5d0 = local_718;
            iVar14 = (uint)local_710;
          }
          else {
            uVar11 = iVar14 - 1;
            local_5f8 = (ulong)((uVar11 ^ uVar32) + uVar13);
            iVar12 = ((int)((uint)local_6f0 * uVar11) >> ((byte)local_690 & 0x1f) ^ uVar32) + uVar13
            ;
            local_6f0 = (uint8_t *)CONCAT44(local_6f0._4_4_,iVar12);
            iVar18 = get_coeff_dist((int)local_6d0,iVar12,(int)local_690,local_698,iVar29);
            paiVar35 = (int (*) [26])(iVar18 - (long)local_6f8);
            local_6d0 = (int (*) [26])CONCAT44(local_6d0._4_4_,uVar11);
            iVar14 = (uint)local_710;
            uVar32 = get_coeff_cost_general
                               (0,iVar29,uVar11,uVar13,iVar24,(uint)local_710,local_6b8,
                                (int)local_728,'\x01',levels_buf);
            local_5d0 = (int (*) [26])((long)*local_718 + (long)*paiVar35);
            iVar12 = (int)local_730;
            local_700 = paiVar35;
          }
          txb_costs = local_6b8;
          local_5c8 = (ulong)uVar32;
          local_69c = 0;
          uVar32 = 0;
          if ((iVar12 != 0) && (uVar32 = 1, iVar28 / 8 < iVar12)) {
            uVar32 = iVar28 / 4 < iVar12 | 2;
          }
          local_720 = (int (*) [26])((long)local_720 - (long)local_6f8);
          local_65c = iVar12 + 1;
          iVar12 = get_eob_cost(local_65c,local_668,local_6b8,'\x01');
          uVar13 = local_67c;
          uVar36 = local_728;
          iVar29 = (int)local_6c0;
          iVar34 = (int)local_728;
          iVar24 = get_coeff_cost_eob(iVar29,(tran_low_t)local_6e8,local_67c,uVar32,iVar14,txb_costs
                                      ,iVar34,'\x01');
          local_600 = (int (*) [8])CONCAT44(local_600._4_4_,iVar12);
          local_6f8 = (int (*) [26])CONCAT44(local_6f8._4_4_,iVar24 + iVar12);
          lVar17 = (long)local_720 * 0x80 + ((iVar24 + iVar12) * local_6d8 + 0x100 >> 9);
          paiVar35 = local_720;
          if ((int)local_6d0 != 0) {
            iVar12 = get_coeff_cost_eob(iVar29,(int)local_6d0,uVar13,uVar32,(uint)local_710,
                                        txb_costs,iVar34,'\x01');
            lVar22 = (long)local_700 * 0x80 + ((iVar12 + (int)local_600) * local_6d8 + 0x100 >> 9);
            paiVar35 = local_720;
            if (lVar22 < lVar17) {
              local_69c = 1;
              local_6f8 = (int (*) [26])CONCAT44(local_6f8._4_4_,iVar12 + (int)local_600);
              paiVar35 = local_700;
              lVar17 = lVar22;
            }
          }
          iVar24 = (int)local_6c8;
          lVar22 = (long)((long)*local_720 + (long)*local_718) * 0x80 +
                   (((int)local_6b0 + iVar24) * local_6d8 + 0x100 >> 9);
          iVar12 = 0;
          uVar13 = (uint)local_730;
          paiVar26 = local_720;
          if ((uVar13 < 6) + 1 < (uint)local_6e8 || sharpness == 0) {
            lVar30 = (long)local_5d0 * 0x80 + (((int)local_5c8 + iVar24) * local_6d8 + 0x100 >> 9);
            iVar12 = 0;
            if (lVar30 < lVar22) {
              local_6b0 = (uint8_t *)CONCAT44(local_6b0._4_4_,(int)local_5c8);
              iVar12 = 1;
              lVar22 = lVar30;
              paiVar26 = local_700;
            }
          }
          if ((sharpness == 0 || 3 < uVar13) && (lVar17 < lVar22)) {
            uVar27 = local_6e0 & 0xffffffff;
            if ((int)local_6e0 < 1) {
              uVar27 = 0;
            }
            for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
              iVar12 = nz_ci[uVar19];
              levels_buf[iVar12 + (iVar12 >> ((byte)uVar36 & 0x1f)) * 4] = '\0';
              local_678[iVar12] = 0;
              local_708[iVar12] = 0;
            }
            local_658 = (ulong)local_65c;
            uVar19 = 0;
            uVar32 = (uint)local_6f8;
            iVar12 = local_69c;
          }
          else {
            uVar32 = (int)local_6b0 + iVar24;
            paiVar35 = (int (*) [26])((long)*local_718 + (long)*paiVar26);
            uVar19 = local_6e0;
          }
          if (iVar12 != 0) {
            local_678[local_6c0] = (tran_low_t)local_5f8;
            local_708[local_6c0] = (uint)local_6f0;
            uVar8 = (uint8_t)local_6d0;
            if (0x7e < (int)local_6d0) {
              uVar8 = '\x7f';
            }
            *local_5e8 = uVar8;
          }
          qcoeff = local_678;
          local_718 = paiVar35;
          if (local_678[local_6c0] != 0) {
            nz_ci[(int)uVar19] = (int)local_6c0;
            uVar19 = (ulong)((int)uVar19 + 1);
          }
        }
        uVar27 = (ulong)(uVar13 - 1);
        dqcoeff_00 = local_708;
        scan = local_688;
      }
      goto LAB_002201aa;
    }
    if (iVar12 == 2) {
      local_5d8 = (uint8_t *)(long)(1 << (bVar23 & 0x1f));
      iVar28 = iVar28 << (bVar23 & 0x1f);
      local_5f0 = CONCAT44(local_5f0._4_4_,~(-1 << (bVar23 & 0x1f)));
      local_600 = local_6b8->base_cost;
      local_65c = iVar28 / 8;
      uVar19 = 1;
      paiVar35 = local_640;
      while ((-1 < (int)uVar27 && ((int)uVar19 < 3))) {
        local_720 = (int (*) [26])CONCAT44(local_720._4_4_,txb_ctx->dc_sign_ctx);
        sVar2 = scan[uVar27];
        puVar33 = (uint8_t *)(long)sVar2;
        local_730 = uVar27;
        local_6e0 = uVar19;
        local_6c8 = (int (*) [26])(ulong)uVar32;
        iVar12 = get_dqv(local_620,(int)sVar2,local_628);
        uVar32 = qcoeff[(long)puVar33];
        lVar17 = (long)((int)sVar2 + ((int)sVar2 >> ((byte)uVar36 & 0x1f)) * 4);
        uVar13 = (uint)""[levels_buf[lVar17 + 4]] +
                 (uint)""[levels_buf[lVar17 + 3]] +
                 (uint)""[levels_buf[lVar17 + 2]] + (uint)""[levels_buf[lVar17 + 1]] +
                 (uint)""[(local_5d8 + 4)[(long)(levels_buf + lVar17)]] + 1 >> 1;
        uVar27 = (ulong)uVar13;
        if (3 < uVar13) {
          uVar27 = 4;
        }
        iVar24 = nz_map_ctx_offset_1d[(int)sVar2 & (uint)local_5f0];
        if (uVar32 == 0) {
          uVar32 = (int)local_6c8 + local_600[uVar27 + (long)iVar24][0];
          uVar13 = (uint)local_730;
          uVar19 = local_6e0;
        }
        else {
          uVar13 = -uVar32;
          if (0 < (int)uVar32) {
            uVar13 = uVar32;
          }
          local_6e8 = (int *)(ulong)uVar13;
          iVar29 = local_650[(long)puVar33];
          lVar22 = (long)(iVar29 << ((byte)local_690 & 0x1f));
          if (local_698 == (qm_val_t *)0x0) {
            local_6f8 = (int (*) [26])(lVar22 * lVar22);
          }
          else {
            local_6f8 = (int (*) [26])
                        ((ulong)local_698[(long)puVar33] * lVar22 *
                         (ulong)local_698[(long)puVar33] * lVar22 + 0x200 >> 10);
          }
          iVar34 = -((int)uVar32 >> 0x1f);
          local_700 = (int (*) [26])CONCAT44(local_700._4_4_,uVar32);
          iVar14 = (int)sVar2;
          local_718 = paiVar35;
          local_5e0 = levels_buf + lVar17;
          local_6c0._0_4_ = iVar29;
          local_6f0._0_4_ = iVar12;
          local_710 = (int (*) [26])
                      get_coeff_dist(iVar29,dqcoeff_00[(long)puVar33],(int)local_690,local_698,
                                     iVar14);
          iVar29 = (int)local_6e8;
          iVar12 = (int)(uVar27 + (long)iVar24);
          iVar24 = (int)local_728;
          local_67c = get_coeff_cost_general
                                (0,iVar14,iVar29,iVar34,iVar12,(uint)local_720,local_6b8,iVar24,
                                 '\x02',levels_buf);
          local_6d0 = (int (*) [26])CONCAT44(local_6d0._4_4_,iVar34);
          local_6b0 = puVar33;
          if (iVar29 == 1) {
            uVar32 = local_600[iVar12][0];
            local_610 = (int (*) [8])0x0;
            local_6f0 = (uint8_t *)((ulong)local_6f0._4_4_ << 0x20);
            local_700 = (int (*) [26])0x0;
            local_6c0 = (ulong)local_6c0._4_4_ << 0x20;
            local_5d0 = local_718;
          }
          else {
            uVar32 = iVar29 - 1;
            local_610 = (int (*) [8])(ulong)((uVar32 ^ (int)(uint)local_700 >> 0x1f) + iVar34);
            iVar29 = ((int)((uint)local_6f0 * uVar32) >> ((byte)local_690 & 0x1f) ^
                     (int)(uint)local_700 >> 0x1f) + iVar34;
            local_6f0 = (uint8_t *)CONCAT44(local_6f0._4_4_,iVar29);
            iVar18 = get_coeff_dist((int)local_6c0,iVar29,(int)local_690,local_698,(int)sVar2);
            paiVar35 = (int (*) [26])(iVar18 - (long)local_6f8);
            local_6c0 = CONCAT44(local_6c0._4_4_,uVar32);
            uVar32 = get_coeff_cost_general
                               (0,iVar14,uVar32,iVar34,iVar12,(uint)local_720,local_6b8,iVar24,
                                '\x02',levels_buf);
            local_5d0 = (int (*) [26])((long)*local_718 + (long)*paiVar35);
            local_700 = paiVar35;
          }
          pLVar5 = local_6b8;
          local_5c8 = (ulong)uVar32;
          local_69c = 0;
          uVar32 = 0;
          iVar12 = (int)local_730;
          if ((iVar12 != 0) && (uVar32 = 1, (int)local_65c < iVar12)) {
            uVar32 = iVar28 / 4 < iVar12 | 2;
          }
          paiVar35 = (int (*) [26])((long)local_710 - (long)local_6f8);
          local_5f8 = CONCAT44(local_5f8._4_4_,iVar12 + 1);
          iVar12 = get_eob_cost(iVar12 + 1,local_668,local_6b8,'\x02');
          iVar29 = (int)local_6b0;
          iVar14 = (int)local_728;
          iVar24 = get_coeff_cost_eob(iVar29,(tran_low_t)local_6e8,(int)local_6d0,uVar32,
                                      (uint)local_720,pLVar5,iVar14,'\x02');
          local_5e8 = (uint8_t *)CONCAT44(local_5e8._4_4_,iVar12);
          local_6f8 = (int (*) [26])CONCAT44(local_6f8._4_4_,iVar24 + iVar12);
          lVar17 = (long)paiVar35 * 0x80 + ((iVar24 + iVar12) * local_6d8 + 0x100 >> 9);
          local_710 = paiVar35;
          if ((int)local_6c0 != 0) {
            iVar12 = get_coeff_cost_eob(iVar29,(int)local_6c0,(int)local_6d0,uVar32,(uint)local_720,
                                        pLVar5,iVar14,'\x02');
            lVar22 = (long)local_700 * 0x80 + ((iVar12 + (int)local_5e8) * local_6d8 + 0x100 >> 9);
            paiVar35 = local_710;
            if (lVar22 < lVar17) {
              local_69c = 1;
              local_6f8 = (int (*) [26])CONCAT44(local_6f8._4_4_,iVar12 + (int)local_5e8);
              paiVar35 = local_700;
              lVar17 = lVar22;
            }
          }
          iVar24 = (int)local_6c8;
          lVar22 = (long)((long)*local_710 + (long)*local_718) * 0x80 +
                   ((int)(local_67c + iVar24) * local_6d8 + 0x100 >> 9);
          iVar12 = 0;
          uVar13 = (uint)local_730;
          paiVar26 = local_710;
          uVar32 = local_67c;
          if ((uVar13 < 6) + 1 < (uint)local_6e8 || sharpness == 0) {
            lVar30 = (long)local_5d0 * 0x80 +
                     ((int)((uint)local_5c8 + iVar24) * local_6d8 + 0x100 >> 9);
            if (lVar30 < lVar22) {
              iVar12 = 1;
              lVar22 = lVar30;
              paiVar26 = local_700;
              uVar32 = (uint)local_5c8;
            }
          }
          if ((sharpness == 0 || 3 < uVar13) && (lVar17 < lVar22)) {
            uVar27 = local_6e0 & 0xffffffff;
            if ((int)local_6e0 < 1) {
              uVar27 = 0;
            }
            for (uVar19 = 0; uVar27 != uVar19; uVar19 = uVar19 + 1) {
              iVar12 = nz_ci[uVar19];
              levels_buf[iVar12 + (iVar12 >> ((byte)local_728 & 0x1f)) * 4] = '\0';
              local_678[iVar12] = 0;
              local_708[iVar12] = 0;
            }
            local_658 = local_5f8 & 0xffffffff;
            uVar19 = 0;
            uVar32 = (uint)local_6f8;
            iVar12 = local_69c;
          }
          else {
            uVar32 = uVar32 + iVar24;
            paiVar35 = (int (*) [26])((long)*local_718 + (long)*paiVar26);
            uVar19 = local_6e0;
          }
          if (iVar12 != 0) {
            local_678[(long)local_6b0] = (tran_low_t)local_610;
            local_708[(long)local_6b0] = (uint)local_6f0;
            uVar8 = (uint8_t)local_6c0;
            if (0x7e < (int)local_6c0) {
              uVar8 = '\x7f';
            }
            *local_5e0 = uVar8;
          }
          qcoeff = local_678;
          dqcoeff_00 = local_708;
          if (local_678[(long)local_6b0] != 0) {
            nz_ci[(int)uVar19] = (int)local_6b0;
            uVar19 = (ulong)((int)uVar19 + 1);
          }
        }
        uVar27 = (ulong)(uVar13 - 1);
        scan = local_688;
        uVar36 = local_728;
      }
      goto LAB_002201aa;
    }
    uVar32 = 1;
  }
  iVar24 = (int)uVar36;
  iVar28 = (int)uVar27;
  if ((((sharpness == 0) && (iVar28 == -1)) && ((int)uVar32 < 3)) &&
     (iVar12 = (int)local_670,
     local_6d8 * iVar15 + 0x100 >> 9 <
     (long)local_640 * 0x80 + (((long)(int)local_734 + (long)iVar10) * local_6d8 + 0x100 >> 9))) {
    uVar20 = 0;
    uVar19 = (ulong)uVar32;
    if ((int)uVar32 < 1) {
      uVar19 = uVar20;
    }
    for (; uVar19 != uVar20; uVar20 = uVar20 + 1) {
      iVar29 = nz_ci[uVar20];
      qcoeff[iVar29] = 0;
      dqcoeff_00[iVar29] = 0;
    }
    local_734 = 0;
    local_658 = 0;
  }
  bVar23 = (byte)uVar36;
  uVar32 = local_734;
  if (iVar12 == 0) {
    local_668 = (LV_MAP_EOB_COST *)(long)(1 << (bVar23 & 0x1f));
    local_6e8 = local_668->eob_cost[0] + 1;
    local_6b0 = (uint8_t *)(long)(2 << (bVar23 & 0x1f));
    local_718 = (int (*) [26])local_6b8->base_cost;
    local_6f8 = local_6b8->lps_cost;
    while (iVar24 = (int)uVar36, dqcoeff_00 = local_708, 0 < (int)uVar27) {
      sVar2 = scan[uVar27];
      lVar22 = (long)sVar2;
      iVar28 = (int)sVar2;
      local_730 = uVar27;
      iVar12 = get_dqv(local_620,iVar28,local_628);
      iVar24 = (int)sVar2 >> ((byte)uVar36 & 0x1f);
      lVar17 = (long)((int)sVar2 + iVar24 * 4);
      paiVar35 = (int (*) [26])(levels_buf + lVar17);
      if (lVar22 == 0) {
        lVar17 = 0;
      }
      else {
        uVar13 = (uint)""[levels_buf[lVar17 + 2]] +
                 (uint)""[(levels_buf + lVar17 + 8)[(long)local_6b0]] +
                 (uint)""[(levels_buf + lVar17 + 5)[(long)local_668]] +
                 (uint)""[levels_buf[lVar17 + 1]] +
                 (uint)""[*(byte *)((long)*paiVar35 + (long)local_6e8)] + 1 >> 1;
        uVar27 = (ulong)uVar13;
        if (3 < uVar13) {
          uVar27 = 4;
        }
        lVar17 = uVar27 + (long)av1_nz_map_ctx_offset[local_630][lVar22];
      }
      uVar13 = qcoeff[lVar22];
      if (uVar13 == 0) {
        iVar12 = (*local_718)[lVar17 * 8];
      }
      else {
        local_720 = (int (*) [26])CONCAT44(local_720._4_4_,iVar12);
        local_710 = (int (*) [26])CONCAT44(local_710._4_4_,uVar32);
        local_6f0 = (uint8_t *)CONCAT44(local_6f0._4_4_,uVar13);
        uVar32 = -uVar13;
        if (0 < (int)uVar13) {
          uVar32 = uVar13;
        }
        uVar13 = local_650[lVar22];
        uVar11 = -uVar13;
        if (0 < (int)uVar13) {
          uVar11 = uVar13;
        }
        uVar13 = local_708[lVar22];
        uVar31 = -uVar13;
        if (0 < (int)uVar13) {
          uVar31 = uVar13;
        }
        uVar27 = 3;
        if (uVar32 < 3) {
          uVar27 = (ulong)uVar32;
        }
        iVar29 = (*local_718)[lVar17 * 8 + uVar27];
        local_6c8 = paiVar35;
        if (uVar32 < 4) {
          iVar14 = (*local_718)[lVar17 * 8 + (ulong)uVar32 + 4];
          iVar12 = iVar29 + 0x200;
          if (uVar32 == 3) goto LAB_00220bef;
        }
        else {
          iVar14 = 0;
LAB_00220bef:
          local_6e0 = CONCAT44(local_6e0._4_4_,iVar14);
          iVar14 = iVar28 - (iVar24 << ((byte)local_728 & 0x1f));
          iVar12 = iVar24 * (int)local_6e8 + iVar14;
          lVar17 = (long)(iVar12 + (int)local_6e8);
          uVar13 = (uint)levels_buf[lVar17 + 1] +
                   (uint)levels_buf[lVar17] + (uint)levels_buf[(long)iVar12 + 1] + 1 >> 1;
          uVar27 = (ulong)uVar13;
          if (5 < uVar13) {
            uVar27 = 6;
          }
          if (sVar2 != 0) {
            if (iVar24 < 2 && iVar14 < 2) {
              uVar27 = (ulong)((int)uVar27 + 7);
            }
            else {
              uVar27 = (ulong)((int)uVar27 + 0xe);
            }
          }
          dummy_dist = dummy_dist & 0xffffffff00000000;
          iVar12 = get_br_cost_with_diff(uVar32,local_6f8[uVar27],(int *)&dummy_dist);
          iVar12 = iVar12 + iVar29 + 0x200;
          iVar14 = (int)local_6e0 + (int)dummy_dist;
        }
        uVar36 = local_690;
        pqVar6 = local_698;
        if (uVar11 <= uVar31) {
          local_6e0 = CONCAT44(local_6e0._4_4_,iVar14);
          local_6c0 = CONCAT71(local_6c0._1_7_,sharpness != 0);
          iVar24 = (int)local_690;
          local_6d0 = (int (*) [26])get_coeff_dist(uVar11,uVar31,iVar24,local_698,iVar28);
          local_700 = (int (*) [26])CONCAT44(local_700._4_4_,uVar32 - 1);
          iVar28 = (int)((uint)local_720 * (uVar32 - 1)) >> ((byte)uVar36 & 0x1f);
          local_720 = (int (*) [26])CONCAT44(local_720._4_4_,iVar28);
          iVar18 = get_coeff_dist(uVar11,iVar28,iVar24,pqVar6,(int)sVar2);
          if (((byte)local_6c0 & uVar32 < 2) == 0) {
            scan = local_688;
            uVar36 = local_728;
            uVar32 = (uint)local_710;
            if (iVar18 * 0x80 + ((iVar12 - (int)local_6e0) * local_6d8 + 0x100 >> 9) <
                (long)local_6d0 * 0x80 + (iVar12 * local_6d8 + 0x100 >> 9)) {
              uVar13 = (int)(uint)local_6f0 >> 0x1f;
              local_678[lVar22] = ((uint)local_700 ^ uVar13) + -uVar13;
              local_708[lVar22] = ((uint)local_720 ^ uVar13) + -uVar13;
              uVar8 = (uint8_t)local_700;
              if (0x7e < (uint)local_700) {
                uVar8 = '\x7f';
              }
              *(uint8_t *)*local_6c8 = uVar8;
              iVar12 = iVar12 - (int)local_6e0;
            }
            goto LAB_00220dce;
          }
        }
        scan = local_688;
        uVar36 = local_728;
        uVar32 = (uint)local_710;
      }
LAB_00220dce:
      uVar32 = uVar32 + iVar12;
      qcoeff = local_678;
      uVar27 = local_730 - 1;
    }
  }
  else if (iVar12 == 1) {
    local_6e0 = (long)(1 << (bVar23 & 0x1f)) + 4;
    local_718 = (int (*) [26])(long)(2 << (bVar23 & 0x1f));
    local_6c8 = (int (*) [26])(long)(3 << (bVar23 & 0x1f));
    local_6f0 = (uint8_t *)(long)(4 << (bVar23 & 0x1f));
    local_668 = (LV_MAP_EOB_COST *)local_6b8->base_cost;
    local_6f8 = (int (*) [26])CONCAT44(local_6f8._4_4_,(int)local_6e0 * 2);
    local_700 = local_6b8->lps_cost;
    while (iVar24 = (int)uVar36, 0 < (int)uVar27) {
      sVar2 = scan[uVar27];
      iVar24 = (int)sVar2;
      local_730 = uVar27;
      iVar12 = get_dqv(local_620,iVar24,local_628);
      iVar28 = (int)sVar2 >> ((byte)uVar36 & 0x1f);
      lVar17 = (long)((int)sVar2 + iVar28 * 4);
      puVar33 = levels_buf + lVar17;
      uVar13 = (uint)""[(local_6f0 + 0x10)[(long)puVar33]] +
               (uint)""[*(byte *)((long)(*local_6c8 + 3) + (long)puVar33)] +
               (uint)""[*(byte *)((long)(*local_718 + 2) + (long)puVar33)] +
               (uint)""[levels_buf[lVar17 + 1]] + (uint)""[puVar33[local_6e0]] + 1 >> 1;
      uVar27 = (ulong)uVar13;
      if (3 < uVar13) {
        uVar27 = 4;
      }
      uVar13 = qcoeff[sVar2];
      if (uVar13 == 0) {
        iVar12 = local_668->eob_cost[0][(uVar27 + (long)nz_map_ctx_offset_1d[iVar28]) * 8];
      }
      else {
        local_710 = (int (*) [26])CONCAT44(local_710._4_4_,iVar12);
        local_6e8 = (int *)CONCAT44(local_6e8._4_4_,uVar32);
        local_6c0 = CONCAT44(local_6c0._4_4_,uVar13);
        uVar32 = -uVar13;
        if (0 < (int)uVar13) {
          uVar32 = uVar13;
        }
        uVar13 = local_650[sVar2];
        uVar11 = -uVar13;
        if (0 < (int)uVar13) {
          uVar11 = uVar13;
        }
        uVar13 = local_708[sVar2];
        uVar31 = -uVar13;
        if (0 < (int)uVar13) {
          uVar31 = uVar13;
        }
        iVar12 = (int)(uVar27 + (long)nz_map_ctx_offset_1d[iVar28]);
        uVar27 = 3;
        if (uVar32 < 3) {
          uVar27 = (ulong)uVar32;
        }
        iVar29 = local_668->eob_cost[0][(long)iVar12 * 8 + uVar27];
        local_6b0 = puVar33;
        if (uVar32 < 4) {
          iVar14 = local_668->eob_cost[0][(long)iVar12 * 8 + (ulong)uVar32 + 4];
          iVar12 = iVar29 + 0x200;
          if (uVar32 == 3) goto LAB_00220813;
        }
        else {
          iVar14 = 0;
LAB_00220813:
          local_720 = (int (*) [26])CONCAT44(local_720._4_4_,iVar14);
          iVar12 = iVar28 * (int)local_6e0 + (iVar24 - (iVar28 << ((byte)local_728 & 0x1f)));
          uVar13 = (uint)levels_buf[(int)(iVar12 + (uint)local_6f8)] +
                   (uint)levels_buf[(int)local_6e0 + iVar12] + (uint)levels_buf[(long)iVar12 + 1] +
                   1 >> 1;
          if (5 < uVar13) {
            uVar13 = 6;
          }
          if (sVar2 != 0) {
            if (iVar28 == 0) {
              uVar13 = uVar13 + 7;
            }
            else {
              uVar13 = uVar13 + 0xe;
            }
          }
          dummy_dist = dummy_dist & 0xffffffff00000000;
          iVar12 = get_br_cost_with_diff(uVar32,local_700[uVar13],(int *)&dummy_dist);
          iVar12 = iVar12 + iVar29 + 0x200;
          iVar14 = (uint)local_720 + (int)dummy_dist;
        }
        uVar36 = local_690;
        pqVar6 = local_698;
        if (uVar11 <= uVar31) {
          local_720 = (int (*) [26])CONCAT44(local_720._4_4_,iVar14);
          local_6d0 = (int (*) [26])CONCAT71(local_6d0._1_7_,sharpness != 0);
          iVar29 = (int)local_690;
          local_630 = get_coeff_dist(uVar11,uVar31,iVar29,local_698,iVar24);
          local_67c = uVar32 - 1;
          iVar28 = (int)((uint)local_710 * local_67c) >> ((byte)uVar36 & 0x1f);
          local_710 = (int (*) [26])CONCAT44(local_710._4_4_,iVar28);
          iVar18 = get_coeff_dist(uVar11,iVar28,iVar29,pqVar6,(int)sVar2);
          if (((byte)local_6d0 & uVar32 < 2) == 0) {
            scan = local_688;
            uVar36 = local_728;
            uVar32 = (uint)local_6e8;
            if (iVar18 * 0x80 + ((int)(iVar12 - (uint)local_720) * local_6d8 + 0x100 >> 9) <
                (long)(local_630 * 0x80 + (iVar12 * local_6d8 + 0x100 >> 9))) {
              uVar13 = (int)local_6c0 >> 0x1f;
              local_678[sVar2] = (local_67c ^ uVar13) + -uVar13;
              local_708[sVar2] = ((uint)local_710 ^ uVar13) + -uVar13;
              uVar8 = (uint8_t)local_67c;
              if (0x7e < local_67c) {
                uVar8 = '\x7f';
              }
              *local_6b0 = uVar8;
              iVar12 = iVar12 - (uint)local_720;
            }
            goto LAB_002209f7;
          }
        }
        scan = local_688;
        uVar36 = local_728;
        uVar32 = (uint)local_6e8;
      }
LAB_002209f7:
      uVar32 = uVar32 + iVar12;
      dqcoeff_00 = local_708;
      qcoeff = local_678;
      uVar27 = local_730 - 1;
    }
  }
  else {
    if (iVar12 != 2) goto LAB_00220e1a;
    local_6e0 = (long)(1 << (bVar23 & 0x1f)) + 4;
    local_718 = (int (*) [26])CONCAT44(local_718._4_4_,~(-1 << (bVar23 & 0x1f)));
    local_6c8 = (int (*) [26])local_6b8->base_cost;
    local_6d0 = local_6b8->lps_cost;
    while (iVar24 = (int)uVar36, 0 < (int)uVar27) {
      sVar2 = scan[uVar27];
      uVar11 = (uint)sVar2;
      local_730 = uVar27;
      iVar12 = get_dqv(local_620,uVar11,local_628);
      iVar28 = (int)sVar2 >> ((byte)uVar36 & 0x1f);
      lVar17 = (long)((int)sVar2 + iVar28 * 4);
      puVar33 = levels_buf + lVar17;
      uVar13 = (uint)""[levels_buf[lVar17 + 4]] +
               (uint)""[levels_buf[lVar17 + 3]] +
               (uint)""[levels_buf[lVar17 + 2]] + (uint)""[levels_buf[lVar17 + 1]] +
               (uint)""[puVar33[local_6e0]] + 1 >> 1;
      uVar27 = (ulong)uVar13;
      if (3 < uVar13) {
        uVar27 = 4;
      }
      uVar13 = qcoeff[sVar2];
      if (uVar13 == 0) {
        iVar12 = (*local_6c8)[(uVar27 + (long)nz_map_ctx_offset_1d[uVar11 & (uint)local_718]) * 8];
      }
      else {
        local_710 = (int (*) [26])CONCAT44(local_710._4_4_,iVar12);
        local_6e8 = (int *)CONCAT44(local_6e8._4_4_,uVar32);
        local_668 = (LV_MAP_EOB_COST *)CONCAT44(local_668._4_4_,uVar13);
        uVar32 = -uVar13;
        if (0 < (int)uVar13) {
          uVar32 = uVar13;
        }
        uVar13 = local_650[sVar2];
        uVar31 = -uVar13;
        if (0 < (int)uVar13) {
          uVar31 = uVar13;
        }
        uVar13 = local_708[sVar2];
        dqcoeff = -uVar13;
        if (0 < (int)uVar13) {
          dqcoeff = uVar13;
        }
        iVar12 = (int)(uVar27 + (long)nz_map_ctx_offset_1d[uVar11 & (uint)local_718]);
        uVar27 = 3;
        if (uVar32 < 3) {
          uVar27 = (ulong)uVar32;
        }
        iVar24 = (*local_6c8)[(long)iVar12 * 8 + uVar27];
        local_6f0 = puVar33;
        if (uVar32 < 4) {
          iVar29 = (*local_6c8)[(long)iVar12 * 8 + (ulong)uVar32 + 4];
          iVar12 = iVar24 + 0x200;
          if (uVar32 == 3) goto LAB_0022043b;
        }
        else {
          iVar29 = 0;
LAB_0022043b:
          local_720 = (int (*) [26])CONCAT44(local_720._4_4_,iVar29);
          uVar25 = iVar28 << ((byte)local_728 & 0x1f);
          iVar12 = iVar28 * (int)local_6e0 + (uVar11 - uVar25);
          uVar13 = (uint)levels_buf[(long)iVar12 + 2] +
                   (uint)levels_buf[(int)local_6e0 + iVar12] + (uint)levels_buf[(long)iVar12 + 1] +
                   1 >> 1;
          if (5 < uVar13) {
            uVar13 = 6;
          }
          if (sVar2 != 0) {
            if (uVar11 == uVar25) {
              uVar13 = uVar13 + 7;
            }
            else {
              uVar13 = uVar13 + 0xe;
            }
          }
          dummy_dist = dummy_dist & 0xffffffff00000000;
          iVar12 = get_br_cost_with_diff(uVar32,local_6d0[uVar13],(int *)&dummy_dist);
          iVar12 = iVar12 + iVar24 + 0x200;
          iVar29 = (uint)local_720 + (int)dummy_dist;
        }
        uVar36 = local_690;
        pqVar6 = local_698;
        if (uVar31 <= dqcoeff) {
          local_720 = (int (*) [26])CONCAT44(local_720._4_4_,iVar29);
          local_6b0 = (uint8_t *)CONCAT71(local_6b0._1_7_,sharpness != 0);
          iVar24 = (int)local_690;
          local_6c0 = get_coeff_dist(uVar31,dqcoeff,iVar24,local_698,(int)sVar2);
          local_630 = CONCAT44(local_630._4_4_,uVar32 - 1);
          iVar28 = (int)((uint)local_710 * (uVar32 - 1)) >> ((byte)uVar36 & 0x1f);
          local_710 = (int (*) [26])CONCAT44(local_710._4_4_,iVar28);
          iVar18 = get_coeff_dist(uVar31,iVar28,iVar24,pqVar6,(int)sVar2);
          if (((byte)local_6b0 & uVar32 < 2) == 0) {
            scan = local_688;
            uVar36 = local_728;
            uVar32 = (uint)local_6e8;
            if (iVar18 * 0x80 + ((int)(iVar12 - (uint)local_720) * local_6d8 + 0x100 >> 9) <
                local_6c0 * 0x80 + (iVar12 * local_6d8 + 0x100 >> 9)) {
              uVar13 = (int)local_668 >> 0x1f;
              local_678[sVar2] = ((uint)local_630 ^ uVar13) + -uVar13;
              local_708[sVar2] = ((uint)local_710 ^ uVar13) + -uVar13;
              uVar8 = (uint8_t)local_630;
              if (0x7e < (uint)local_630) {
                uVar8 = '\x7f';
              }
              *local_6f0 = uVar8;
              iVar12 = iVar12 - (uint)local_720;
            }
            goto LAB_0022061c;
          }
        }
        scan = local_688;
        uVar36 = local_728;
        uVar32 = (uint)local_6e8;
      }
LAB_0022061c:
      uVar32 = uVar32 + iVar12;
      dqcoeff_00 = local_708;
      qcoeff = local_678;
      uVar27 = local_730 - 1;
    }
  }
  local_734 = uVar32;
  iVar28 = (int)uVar27;
  iVar12 = (int)local_670;
LAB_00220e1a:
  if (iVar28 == 0) {
    dummy_dist = 0;
    update_coeff_general
              ((int *)&local_734,&dummy_dist,0,(int)local_658,(TX_SIZE)local_604,(TX_CLASS)iVar12,
               iVar24,(int)local_618,local_6d8,(int)local_690,txb_ctx->dc_sign_ctx,local_620,scan,
               local_6b8,local_650,qcoeff,dqcoeff_00,levels_buf,local_628,local_698);
  }
  uVar27 = local_658;
  uVar32 = (uint)local_658;
  if (uVar32 != 0) {
    iVar15 = get_tx_type_cost(x,local_6a8,local_634,(TX_SIZE)local_604,tx_type,
                              (uint)(cpi->common).features.reduced_tx_set_used);
    iVar15 = iVar15 + iVar10;
  }
  iVar15 = iVar15 + local_734;
  x->plane[lVar16].eobs[block] = (uint16_t)uVar27;
  uVar8 = av1_get_txb_entropy_context
                    (qcoeff,(SCAN_ORDER *)((long)&av1_scan_orders[0][0].scan + uVar21 + uVar9),
                     uVar32 & 0xffff);
  x->plane[lVar16].txb_entropy_ctx[block] = uVar8;
  *rate_cost = iVar15;
  return uVar32;
}

Assistant:

int av1_optimize_txb(const struct AV1_COMP *cpi, MACROBLOCK *x, int plane,
                     int block, TX_SIZE tx_size, TX_TYPE tx_type,
                     const TXB_CTX *const txb_ctx, int *rate_cost,
                     int sharpness) {
  MACROBLOCKD *xd = &x->e_mbd;
  const struct macroblock_plane *p = &x->plane[plane];
  const SCAN_ORDER *scan_order = get_scan(tx_size, tx_type);
  const int16_t *scan = scan_order->scan;
  const int shift = av1_get_tx_scale(tx_size);
  int eob = p->eobs[block];
  const int16_t *dequant = p->dequant_QTX;
  const qm_val_t *iqmatrix =
      av1_get_iqmatrix(&cpi->common.quant_params, xd, plane, tx_size, tx_type);
  const qm_val_t *qmatrix =
      cpi->oxcf.tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR
          ? av1_get_qmatrix(&cpi->common.quant_params, xd, plane, tx_size,
                            tx_type)
          : NULL;
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  tran_low_t *dqcoeff = p->dqcoeff + block_offset;
  const tran_low_t *tcoeff = p->coeff + block_offset;
  const CoeffCosts *coeff_costs = &x->coeff_costs;

  // This function is not called if eob = 0.
  assert(eob > 0);

  const AV1_COMMON *cm = &cpi->common;
  const PLANE_TYPE plane_type = get_plane_type(plane);
  const TX_SIZE txs_ctx = get_txsize_entropy_ctx(tx_size);
  const TX_CLASS tx_class = tx_type_to_class[tx_type];
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int bhl = get_txb_bhl(tx_size);
  const int width = get_txb_wide(tx_size);
  const int height = get_txb_high(tx_size);
  assert(height == (1 << bhl));
  const int is_inter = is_inter_block(mbmi);
  const LV_MAP_COEFF_COST *txb_costs =
      &coeff_costs->coeff_costs[txs_ctx][plane_type];
  const int eob_multi_size = txsize_log2_minus4[tx_size];
  const LV_MAP_EOB_COST *txb_eob_costs =
      &coeff_costs->eob_costs[eob_multi_size][plane_type];

  // For the IQ and SSIMULACRA 2 tunings, increase rshift from 2 to 4.
  // This biases trellis quantization towards keeping more coefficients, and
  // together with the IQ and SSIMULACRA2 rdmult adjustment in
  // av1_compute_rd_mult_based_on_qindex(), this helps preserve image
  // features (like repeating patterns and camera noise/film grain), which
  // improves SSIMULACRA 2 scores.
  const int rshift = (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
                      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2)
                         ? 7
                         : 5;

  const int64_t rdmult = ROUND_POWER_OF_TWO(
      (int64_t)x->rdmult * (8 - sharpness) *
          (plane_rd_mult[is_inter][plane_type] << (2 * (xd->bd - 8))),
      rshift);

  uint8_t levels_buf[TX_PAD_2D];
  uint8_t *const levels = set_levels(levels_buf, height);

  if (eob > 1) av1_txb_init_levels(qcoeff, width, height, levels);

  // TODO(angirbird): check iqmatrix

  const int non_skip_cost = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][0];
  const int skip_cost = txb_costs->txb_skip_cost[txb_ctx->txb_skip_ctx][1];
  const int eob_cost = get_eob_cost(eob, txb_eob_costs, txb_costs, tx_class);
  int accu_rate = eob_cost;
  int64_t accu_dist = 0;
  int si = eob - 1;
  const int ci = scan[si];
  const tran_low_t qc = qcoeff[ci];
  const tran_low_t abs_qc = abs(qc);
  const int sign = qc < 0;
  const int max_nz_num = 2;
  int nz_num = 1;
  int nz_ci[3] = { ci, 0, 0 };
  if (abs_qc >= 2) {
    update_coeff_general(&accu_rate, &accu_dist, si, eob, tx_size, tx_class,
                         bhl, width, rdmult, shift, txb_ctx->dc_sign_ctx,
                         dequant, scan, txb_costs, tcoeff, qcoeff, dqcoeff,
                         levels, iqmatrix, qmatrix);
    --si;
  } else {
    assert(abs_qc == 1);
    const int coeff_ctx = get_lower_levels_ctx_eob(bhl, width, si);
    accu_rate +=
        get_coeff_cost_eob(ci, abs_qc, sign, coeff_ctx, txb_ctx->dc_sign_ctx,
                           txb_costs, bhl, tx_class);
    const tran_low_t tqc = tcoeff[ci];
    const tran_low_t dqc = dqcoeff[ci];
    const int64_t dist = get_coeff_dist(tqc, dqc, shift, qmatrix, ci);
    const int64_t dist0 = get_coeff_dist(tqc, 0, shift, qmatrix, ci);
    accu_dist += dist - dist0;
    --si;
  }

#define UPDATE_COEFF_EOB_CASE(tx_class_literal)                            \
  case tx_class_literal:                                                   \
    for (; si >= 0 && nz_num <= max_nz_num; --si) {                        \
      update_coeff_eob(&accu_rate, &accu_dist, &eob, &nz_num, nz_ci, si,   \
                       tx_size, tx_class_literal, bhl, width,              \
                       txb_ctx->dc_sign_ctx, rdmult, shift, dequant, scan, \
                       txb_eob_costs, txb_costs, tcoeff, qcoeff, dqcoeff,  \
                       levels, sharpness, iqmatrix, qmatrix);              \
    }                                                                      \
    break
  switch (tx_class) {
    UPDATE_COEFF_EOB_CASE(TX_CLASS_2D);
    UPDATE_COEFF_EOB_CASE(TX_CLASS_HORIZ);
    UPDATE_COEFF_EOB_CASE(TX_CLASS_VERT);
#undef UPDATE_COEFF_EOB_CASE
    default: assert(false);
  }

  if (si == -1 && nz_num <= max_nz_num && sharpness == 0) {
    update_skip(&accu_rate, accu_dist, &eob, nz_num, nz_ci, rdmult, skip_cost,
                non_skip_cost, qcoeff, dqcoeff);
  }

#define UPDATE_COEFF_SIMPLE_CASE(tx_class_literal)                             \
  case tx_class_literal:                                                       \
    for (; si >= 1; --si) {                                                    \
      update_coeff_simple(&accu_rate, si, eob, tx_size, tx_class_literal, bhl, \
                          rdmult, shift, dequant, scan, txb_costs, tcoeff,     \
                          qcoeff, dqcoeff, levels, sharpness, iqmatrix,        \
                          qmatrix);                                            \
    }                                                                          \
    break
  switch (tx_class) {
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_2D);
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_HORIZ);
    UPDATE_COEFF_SIMPLE_CASE(TX_CLASS_VERT);
#undef UPDATE_COEFF_SIMPLE_CASE
    default: assert(false);
  }

  // DC position
  if (si == 0) {
    // no need to update accu_dist because it's not used after this point
    int64_t dummy_dist = 0;
    update_coeff_general(&accu_rate, &dummy_dist, si, eob, tx_size, tx_class,
                         bhl, width, rdmult, shift, txb_ctx->dc_sign_ctx,
                         dequant, scan, txb_costs, tcoeff, qcoeff, dqcoeff,
                         levels, iqmatrix, qmatrix);
  }

  const int tx_type_cost = get_tx_type_cost(x, xd, plane, tx_size, tx_type,
                                            cm->features.reduced_tx_set_used);
  if (eob == 0)
    accu_rate += skip_cost;
  else
    accu_rate += non_skip_cost + tx_type_cost;

  p->eobs[block] = eob;
  p->txb_entropy_ctx[block] =
      av1_get_txb_entropy_context(qcoeff, scan_order, p->eobs[block]);

  *rate_cost = accu_rate;
  return eob;
}